

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

bool __thiscall
cmGlobalUnixMakefileGenerator3::NeedRequiresStep
          (cmGlobalUnixMakefileGenerator3 *this,cmTarget *target)

{
  size_t this_00;
  bool bVar1;
  cmMakefile *pcVar2;
  char *pcVar3;
  reference pbVar4;
  allocator local_d9;
  undefined1 local_d8 [8];
  string var;
  _Self local_b0;
  const_iterator l;
  string local_a0;
  string local_70;
  undefined1 local_50 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  cmTarget *target_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  languages._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)target;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_50);
  this_00 = languages._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pcVar2 = cmTarget::GetMakefile
                     ((cmTarget *)languages._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"CMAKE_BUILD_TYPE",(allocator *)((long)&l._M_node + 7));
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,pcVar3,(allocator *)((long)&l._M_node + 6));
  cmTarget::GetLanguages
            ((cmTarget *)this_00,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&l._M_node + 6));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&l._M_node + 7));
  local_b0._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
  while( true ) {
    var.field_2._8_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
    bVar1 = std::operator!=(&local_b0,(_Self *)((long)&var.field_2 + 8));
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_d8,"CMAKE_NEEDS_REQUIRES_STEP_",&local_d9);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_b0);
    std::__cxx11::string::operator+=((string *)local_d8,(string *)pbVar4);
    std::__cxx11::string::operator+=((string *)local_d8,"_FLAG");
    pcVar2 = cmTarget::GetMakefile
                       ((cmTarget *)languages._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar3 = cmMakefile::GetDefinition(pcVar2,(string *)local_d8);
    if (pcVar3 != (char *)0x0) {
      this_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_d8);
    if (pcVar3 != (char *)0x0) goto LAB_006eaa1a;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_b0);
  }
  this_local._7_1_ = 0;
LAB_006eaa1a:
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalUnixMakefileGenerator3
::NeedRequiresStep(cmTarget const& target)
{
  std::set<std::string> languages;
  target.GetLanguages(languages,
                target.GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE"));
  for(std::set<std::string>::const_iterator l = languages.begin();
      l != languages.end(); ++l)
    {
    std::string var = "CMAKE_NEEDS_REQUIRES_STEP_";
    var += *l;
    var += "_FLAG";
    if(target.GetMakefile()->GetDefinition(var))
      {
      return true;
      }
    }
  return false;
}